

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElasticityCosseratSimple::ComputeStress
          (ChElasticityCosseratSimple *this,ChVector<double> *stress_n,ChVector<double> *stress_m,
          ChVector<double> *strain_n,ChVector<double> *strain_m)

{
  stress_n->m_data[0] = this->E * this->A * strain_n->m_data[0];
  stress_n->m_data[1] = this->Ks_y * this->G * this->A * strain_n->m_data[1];
  stress_n->m_data[2] = this->Ks_z * this->G * this->A * strain_n->m_data[2];
  stress_m->m_data[0] = this->G * this->J * strain_m->m_data[0];
  stress_m->m_data[1] = this->E * this->Iyy * strain_m->m_data[1];
  stress_m->m_data[2] = this->E * this->Izz * strain_m->m_data[2];
  return;
}

Assistant:

void ChElasticityCosseratSimple::ComputeStress(ChVector<>& stress_n,
                                               ChVector<>& stress_m,
                                               const ChVector<>& strain_n,
                                               const ChVector<>& strain_m) {
    stress_n.x() = E * A * strain_n.x();
    stress_n.y() = Ks_y * G * A * strain_n.y();
    stress_n.z() = Ks_z * G * A * strain_n.z();
    stress_m.x() = G * J * strain_m.x();
    stress_m.y() = E * Iyy * strain_m.y();
    stress_m.z() = E * Izz * strain_m.z();
}